

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isGatherOffsetsResultValid<tcu::LookupPrecision,float>
               (ConstPixelBufferAccess *level,Sampler *sampler,LookupPrecision *prec,Vec2 *coord,
               int coordZ,int componentNdx,IVec2 (*offsets) [4],Vector<float,_4> *result)

{
  ulong uVar1;
  int size;
  int size_00;
  int iVar2;
  bool bVar3;
  int y;
  int z;
  ulong uVar4;
  int offNdx;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Vector<bool,_4> res;
  Vector<float,_4> color;
  Vec2 vBounds;
  Vec2 uBounds;
  int local_a8;
  TextureFormat local_88;
  int aiStack_80 [4];
  LookupPrecision *local_70;
  undefined1 local_68 [20];
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  TexVerifierUtil local_40 [8];
  float local_38;
  float local_34;
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(level->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  local_70 = prec;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            (local_40,sampler->normalizedCoords,(level->m_size).m_data[1],coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar6 = floorf(local_38 + -0.5);
  fVar7 = floorf(local_34 + -0.5);
  fVar8 = floorf(local_40._0_4_ + -0.5);
  fVar9 = floorf(local_40._4_4_ + -0.5);
  local_a8 = (int)fVar8;
  if (local_a8 <= (int)fVar9) {
    size = (level->m_size).m_data[0];
    size_00 = (level->m_size).m_data[1];
    iVar2 = (int)fVar6;
    do {
      for (; iVar2 <= (int)fVar7; iVar2 = iVar2 + 1) {
        stack0xffffffffffffffa8 = (undefined1  [16])0x0;
        lVar5 = 0;
        do {
          y = TexVerifierUtil::wrap(sampler->wrapS,(*offsets)[lVar5].m_data[0] + iVar2,size);
          z = TexVerifierUtil::wrap(sampler->wrapT,(*offsets)[lVar5].m_data[1] + local_a8,size_00);
          if ((((y < 0) || ((level->m_size).m_data[0] <= y)) || (z < 0)) ||
             ((((level->m_size).m_data[1] <= z || (coordZ < 0)) ||
              ((level->m_size).m_data[2] <= coordZ)))) {
            sampleTextureBorder<float>(&local_88,(Sampler *)level);
          }
          else {
            ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_68,(int)level,y,z);
            bVar3 = isSRGB(level->m_format);
            if (bVar3) {
              sRGBToLinear((tcu *)&local_88,(Vec4 *)local_68);
            }
            else {
              local_88.type = local_68._4_4_;
              local_88.order = local_68._0_4_;
              aiStack_80[0] = local_68._8_4_;
              aiStack_80[1] = local_68._12_4_;
            }
          }
          *(ChannelOrder *)(local_68 + lVar5 * 4 + 0x10) = (&local_88.order)[componentNdx];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        auVar11._0_4_ = (float)local_68._16_4_ - result->m_data[0];
        auVar11._4_4_ = fStack_54 - result->m_data[1];
        auVar11._8_4_ = fStack_50 - result->m_data[2];
        auVar11._12_4_ = fStack_4c - result->m_data[3];
        uVar4 = CONCAT44(auVar11._4_4_,auVar11._0_4_);
        auVar10._0_8_ = uVar4 ^ 0x8000000080000000;
        auVar10._8_4_ = -auVar11._8_4_;
        auVar10._12_4_ = -auVar11._12_4_;
        auVar11 = maxps(auVar10,auVar11);
        auVar12._4_4_ = -(uint)(auVar11._4_4_ <= (local_70->colorThreshold).m_data[1]);
        auVar12._0_4_ = -(uint)(auVar11._0_4_ <= (local_70->colorThreshold).m_data[0]);
        auVar12._8_4_ = -(uint)(auVar11._8_4_ <= (local_70->colorThreshold).m_data[2]);
        auVar12._12_4_ = -(uint)(auVar11._12_4_ <= (local_70->colorThreshold).m_data[3]);
        auVar11 = packssdw(auVar12,auVar12);
        auVar11 = packsswb(auVar11,auVar11);
        auVar11 = ZEXT416(*(uint *)(local_70->colorMask).m_data) ^ _DAT_00ae46a0 |
                  auVar11 & _DAT_00ae46a0;
        local_68._0_4_ = auVar11._0_4_;
        if (auVar11[0] != '\0') {
          uVar4 = 0xffffffffffffffff;
          do {
            if (uVar4 == 2) {
              return true;
            }
            uVar1 = uVar4 + 1;
            lVar5 = uVar4 + 2;
            uVar4 = uVar1;
          } while (local_68[lVar5] != '\0');
          if (2 < uVar1) {
            return true;
          }
        }
      }
      local_a8 = local_a8 + 1;
      iVar2 = (int)fVar6;
    } while (local_a8 <= (int)fVar9);
  }
  return false;
}

Assistant:

static bool isGatherOffsetsResultValid (const ConstPixelBufferAccess&	level,
										const Sampler&					sampler,
										const PrecType&					prec,
										const Vec2&						coord,
										int								coordZ,
										int								componentNdx,
										const IVec2						(&offsets)[4],
										const Vector<ScalarType, 4>&	result)
{
	const Vec2	uBounds		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(), coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(), coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0, y0) - without wrap mode
	const int	minI		= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int	maxI		= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int	minJ		= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int	maxJ		= deFloorFloatToInt32(vBounds.y()-0.5f);

	const int	w			= level.getWidth();
	const int	h			= level.getHeight();

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			Vector<ScalarType, 4> color;
			for (int offNdx = 0; offNdx < 4; offNdx++)
			{
				// offNdx-th coordinate offset and then wrapped.
				const int x = wrap(sampler.wrapS, i+offsets[offNdx].x(), w);
				const int y = wrap(sampler.wrapT, j+offsets[offNdx].y(), h);
				color[offNdx] = lookup<ScalarType>(level, sampler, x, y, coordZ)[componentNdx];
			}

			if (isColorValid(prec, color, result))
				return true;
		}
	}

	return false;
}